

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O3

int av1_get_comp_reference_type_context(MACROBLOCKD *xd)

{
  _Bool _Var1;
  char cVar2;
  byte bVar3;
  char cVar4;
  byte bVar5;
  bool bVar6;
  MB_MODE_INFO *pMVar7;
  MB_MODE_INFO *pMVar8;
  bool bVar9;
  
  pMVar7 = xd->above_mbmi;
  pMVar8 = xd->left_mbmi;
  _Var1 = xd->up_available;
  if ((_Var1 & xd->left_available) != 1) {
    if (((xd->left_available | _Var1) & 1U) == 0) {
      return 2;
    }
    if (_Var1 != false) {
      pMVar8 = pMVar7;
    }
    if (((pMVar8->field_0xa7 & 0x80) == 0) && (pMVar8->ref_frame[0] < '\x01')) {
      return 2;
    }
    if (pMVar8->ref_frame[1] < '\x01') {
      return 2;
    }
    return (uint)((byte)pMVar8->ref_frame[1] < 5 != '\x04' < pMVar8->ref_frame[0]) << 2;
  }
  if ((pMVar7->field_0xa7 & 0x80) == 0) {
    bVar6 = pMVar7->ref_frame[0] < '\x01';
  }
  else {
    bVar6 = false;
  }
  if ((pMVar8->field_0xa7 & 0x80) == 0) {
    bVar9 = pMVar8->ref_frame[0] < '\x01';
    if ((bool)(bVar6 & bVar9)) {
      return 2;
    }
  }
  else {
    bVar9 = false;
  }
  if (bVar9 || bVar6) {
    if (bVar6) {
      pMVar7 = pMVar8;
    }
    if (pMVar7->ref_frame[1] < '\x01') {
      return 2;
    }
    bVar6 = (byte)pMVar7->ref_frame[1] < 5 != '\x04' < pMVar7->ref_frame[0];
  }
  else {
    cVar2 = pMVar7->ref_frame[0];
    bVar3 = pMVar7->ref_frame[1];
    cVar4 = pMVar8->ref_frame[0];
    bVar5 = pMVar8->ref_frame[1];
    if ('\0' < (char)bVar5 || '\0' < (char)bVar3) {
      if ((char)bVar3 < '\x01' || (char)bVar5 < '\x01') {
        if ((char)bVar3 < '\x01') {
          if ((char)bVar5 < '\x01') {
            return 1;
          }
          if (bVar5 < 5 == '\x04' < cVar4) {
            return 1;
          }
        }
        else if (bVar3 < 5 == '\x04' < cVar2) {
          return 1;
        }
        bVar6 = (byte)(cVar2 - 5U) < 3;
        bVar9 = (byte)(cVar4 - 8U) < 0xfd;
      }
      else {
        bVar6 = bVar3 < 5 == '\x04' < cVar2;
        bVar9 = bVar5 < 5 == '\x04' < cVar4;
        if ((bVar6) && (bVar9)) {
          return 0;
        }
        if (bVar6 || bVar9) {
          return 2;
        }
        bVar6 = cVar2 == '\x05';
        bVar9 = cVar4 != '\x05';
      }
      return (byte)(bVar9 ^ bVar6) + 3;
    }
    bVar6 = (byte)(cVar4 - 8U) < 0xfd != (byte)(cVar2 - 5U) < 3;
  }
  return (uint)bVar6 * 2 + 1;
}

Assistant:

int av1_get_comp_reference_type_context(const MACROBLOCKD *xd) {
  int pred_context;
  const MB_MODE_INFO *const above_mbmi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mbmi = xd->left_mbmi;
  const int above_in_image = xd->up_available;
  const int left_in_image = xd->left_available;

  if (above_in_image && left_in_image) {  // both edges available
    const int above_intra = !is_inter_block(above_mbmi);
    const int left_intra = !is_inter_block(left_mbmi);

    if (above_intra && left_intra) {  // intra/intra
      pred_context = 2;
    } else if (above_intra || left_intra) {  // intra/inter
      const MB_MODE_INFO *inter_mbmi = above_intra ? left_mbmi : above_mbmi;

      if (!has_second_ref(inter_mbmi))  // single pred
        pred_context = 2;
      else  // comp pred
        pred_context = 1 + 2 * has_uni_comp_refs(inter_mbmi);
    } else {  // inter/inter
      const int a_sg = !has_second_ref(above_mbmi);
      const int l_sg = !has_second_ref(left_mbmi);
      const MV_REFERENCE_FRAME frfa = above_mbmi->ref_frame[0];
      const MV_REFERENCE_FRAME frfl = left_mbmi->ref_frame[0];

      if (a_sg && l_sg) {  // single/single
        pred_context = 1 + 2 * (!(IS_BACKWARD_REF_FRAME(frfa) ^
                                  IS_BACKWARD_REF_FRAME(frfl)));
      } else if (l_sg || a_sg) {  // single/comp
        const int uni_rfc =
            a_sg ? has_uni_comp_refs(left_mbmi) : has_uni_comp_refs(above_mbmi);

        if (!uni_rfc)  // comp bidir
          pred_context = 1;
        else  // comp unidir
          pred_context = 3 + (!(IS_BACKWARD_REF_FRAME(frfa) ^
                                IS_BACKWARD_REF_FRAME(frfl)));
      } else {  // comp/comp
        const int a_uni_rfc = has_uni_comp_refs(above_mbmi);
        const int l_uni_rfc = has_uni_comp_refs(left_mbmi);

        if (!a_uni_rfc && !l_uni_rfc)  // bidir/bidir
          pred_context = 0;
        else if (!a_uni_rfc || !l_uni_rfc)  // unidir/bidir
          pred_context = 2;
        else  // unidir/unidir
          pred_context =
              3 + (!((frfa == BWDREF_FRAME) ^ (frfl == BWDREF_FRAME)));
      }
    }
  } else if (above_in_image || left_in_image) {  // one edge available
    const MB_MODE_INFO *edge_mbmi = above_in_image ? above_mbmi : left_mbmi;

    if (!is_inter_block(edge_mbmi)) {  // intra
      pred_context = 2;
    } else {                           // inter
      if (!has_second_ref(edge_mbmi))  // single pred
        pred_context = 2;
      else  // comp pred
        pred_context = 4 * has_uni_comp_refs(edge_mbmi);
    }
  } else {  // no edges available
    pred_context = 2;
  }

  assert(pred_context >= 0 && pred_context < COMP_REF_TYPE_CONTEXTS);
  return pred_context;
}